

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryWriter::writeStart(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *this_00;
  int32_t start;
  U32LEB x;
  string_view local_38;
  
  if ((this->wasm->start).super_IString.str._M_str != (char *)0x0) {
    start = startSection<wasm::BinaryConsts::Section>(this,Start);
    this_00 = this->o;
    Name::Name((Name *)&local_38,(this->wasm->start).super_IString.str);
    x.value = getFunctionIndex(this,(Name)local_38);
    BufferWithRandomAccess::operator<<(this_00,x);
    finishSection(this,start);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeStart() {
  if (!wasm->start.is()) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Start);
  o << U32LEB(getFunctionIndex(wasm->start.str));
  finishSection(start);
}